

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_tests.cpp
# Opt level: O0

void populate_arena(vector<const_char_*,_std::allocator<const_char_*>_> *devices)

{
  bool bVar1;
  reference ppcVar2;
  char *__command;
  undefined8 in_RDI;
  char *d;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  ostringstream command;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  string local_1d0 [32];
  char *local_1b0;
  char **local_1a8;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_1a0;
  undefined8 local_198;
  ostringstream local_180 [376];
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::operator<<((ostream *)local_180,
                  "/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/tests/fake-sys/populate_arena.py"
                 );
  local_198 = local_8;
  local_1a0._M_current =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                          (in_stack_fffffffffffffe18);
  local_1a8 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                 (in_stack_fffffffffffffe18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)in_stack_fffffffffffffe20,
                       (__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)in_stack_fffffffffffffe18);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_1a0);
    local_1b0 = *ppcVar2;
    in_stack_fffffffffffffe20 = std::operator<<((ostream *)local_180," ");
    std::operator<<(in_stack_fffffffffffffe20,local_1b0);
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&local_1a0);
  }
  system(
        "/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/tests/fake-sys/clean_arena.py"
        );
  std::__cxx11::ostringstream::str();
  __command = (char *)std::__cxx11::string::c_str();
  system(__command);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void populate_arena(const std::vector<const char*> &devices) {
    std::ostringstream command;
    command << FAKE_SYS "/populate_arena.py";
    for (auto d : devices) command << " " << d;

    system(FAKE_SYS "/clean_arena.py");
    system(command.str().c_str());
}